

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

int cram_populate_ref(cram_fd *fd,int id,ref_entry *r)

{
  size_t sVar1;
  int iVar2;
  SAM_hdr_type *type;
  SAM_hdr_tag *pSVar3;
  char *pcVar4;
  refs_t *prVar5;
  FILE *__s;
  int *piVar6;
  size_t sVar7;
  bool bVar8;
  char *local_3130;
  uint local_3124;
  int i;
  FILE *fp_1;
  char *fn;
  refs_t *refs;
  size_t sz;
  BGZF *fp;
  stat sb;
  char *base;
  char *extra;
  mFILE *mf;
  char *local_cache;
  char cache [4096];
  char path_tmp [4096];
  char path [4096];
  SAM_hdr_tag *tag;
  SAM_hdr_type *ty;
  char *ref_path;
  ref_entry *r_local;
  int id_local;
  cram_fd *fd_local;
  
  ty = (SAM_hdr_type *)getenv("REF_PATH");
  mf = (mFILE *)getenv("REF_CACHE");
  if (fd->verbose != 0) {
    fprintf(_stderr,"cram_populate_ref on fd %p, id %d\n",fd,(ulong)(uint)id);
  }
  if (((ty == (SAM_hdr_type *)0x0) || (*(char *)&ty->next == '\0')) &&
     ((ty = (SAM_hdr_type *)anon_var_dwarf_18a8d, mf == (mFILE *)0x0 || (*(char *)&mf->fp == '\0')))
     ) {
    sb.__glibc_reserved[2] = (__syscall_slong_t)get_cache_basedir(&base);
    snprintf((char *)&local_cache,0x1000,"%s%s/hts-ref/%%2s/%%2s/%%s",sb.__glibc_reserved[2],base);
    mf = (mFILE *)&local_cache;
    if (fd->verbose != 0) {
      fprintf(_stderr,"Populating local cache: %s\n",mf);
    }
  }
  if (r->name == (char *)0x0) {
    fd_local._4_4_ = -1;
  }
  else {
    type = sam_hdr_find(fd->header,"SQ","SN",r->name);
    if (type == (SAM_hdr_type *)0x0) {
      fd_local._4_4_ = -1;
    }
    else {
      pSVar3 = sam_hdr_find_key(fd->header,type,"M5",(SAM_hdr_tag **)0x0);
      if (pSVar3 != (SAM_hdr_tag *)0x0) {
        if (fd->verbose != 0) {
          fprintf(_stderr,"Querying ref %s\n",pSVar3->str + 3);
        }
        if ((mf != (mFILE *)0x0) && (*(char *)&mf->fp != '\0')) {
          expand_cache_path(path_tmp + 0xff8,(char *)mf,pSVar3->str + 3);
          iVar2 = stat(path_tmp + 0xff8,(stat *)&fp);
          if ((iVar2 == 0) &&
             (sz = (size_t)bgzf_open(path_tmp + 0xff8,"r"), (BGZF *)sz != (BGZF *)0x0)) {
            r->length = sb.st_rdev;
            r->bases_per_line = 0;
            r->line_length = 0;
            r->offset = 0;
            pcVar4 = string_dup(fd->refs->pool,path_tmp + 0xff8);
            r->fn = pcVar4;
            if ((fd->refs->fp != (BGZF *)0x0) && (iVar2 = bgzf_close(fd->refs->fp), iVar2 != 0)) {
              return -1;
            }
            fd->refs->fp = (BGZF *)sz;
            fd->refs->fn = r->fn;
            return 0;
          }
        }
        extra = (char *)open_path_mfile(pSVar3->str + 3,(char *)ty,(char *)0x0);
        if ((mFILE *)extra != (mFILE *)0x0) {
          pcVar4 = (char *)mfsteal((mFILE *)extra,(size_t *)&refs);
          r->seq = pcVar4;
          r->length = (int64_t)refs;
          if ((mf != (mFILE *)0x0) && (*(char *)&mf->fp != '\0')) {
            expand_cache_path(path_tmp + 0xff8,(char *)mf,pSVar3->str + 3);
            if (fd->verbose != 0) {
              fprintf(_stderr,"Path=\'%s\'\n",path_tmp + 0xff8);
            }
            mkdir_prefix(path_tmp + 0xff8,0x3ff);
            local_3124 = 0;
            do {
              sprintf(cache + 0xff8,"%s.tmp_%d",path_tmp + 0xff8,(ulong)local_3124);
              local_3124 = local_3124 + 1;
              __s = fopen(cache + 0xff8,"wx");
              bVar8 = false;
              if (__s == (FILE *)0x0) {
                piVar6 = __errno_location();
                bVar8 = *piVar6 == 0x11;
              }
            } while (bVar8);
            if (__s == (FILE *)0x0) {
              perror(cache + 0xff8);
              return 0;
            }
            sVar1 = r->length;
            sVar7 = fwrite(r->seq,1,r->length,__s);
            if (sVar1 != sVar7) {
              perror(path_tmp + 0xff8);
            }
            iVar2 = paranoid_fclose((FILE *)__s);
            if (iVar2 == -1) {
              unlink(cache + 0xff8);
            }
            else {
              iVar2 = chmod(cache + 0xff8,0x124);
              if (iVar2 == 0) {
                rename(cache + 0xff8,path_tmp + 0xff8);
              }
              else {
                unlink(cache + 0xff8);
              }
            }
          }
          return 0;
        }
        extra = (char *)0x0;
      }
      pSVar3 = sam_hdr_find_key(fd->header,type,"UR",(SAM_hdr_tag **)0x0);
      if (pSVar3 == (SAM_hdr_tag *)0x0) {
        fd_local._4_4_ = -1;
      }
      else {
        iVar2 = strncmp(pSVar3->str + 3,"file:",5);
        if (iVar2 == 0) {
          local_3130 = pSVar3->str + 8;
        }
        else {
          local_3130 = pSVar3->str + 3;
        }
        if (fd->refs->fp != (BGZF *)0x0) {
          iVar2 = bgzf_close(fd->refs->fp);
          if (iVar2 != 0) {
            return -1;
          }
          fd->refs->fp = (BGZF *)0x0;
        }
        prVar5 = refs_load_fai(fd->refs,local_3130,0);
        if (prVar5 == (refs_t *)0x0) {
          fd_local._4_4_ = -1;
        }
        else {
          fd->refs = prVar5;
          if (fd->refs->fp != (BGZF *)0x0) {
            iVar2 = bgzf_close(fd->refs->fp);
            if (iVar2 != 0) {
              return -1;
            }
            fd->refs->fp = (BGZF *)0x0;
          }
          if (fd->refs->fn == (char *)0x0) {
            fd_local._4_4_ = -1;
          }
          else {
            iVar2 = refs2id(fd->refs,fd->header);
            if (iVar2 == -1) {
              fd_local._4_4_ = -1;
            }
            else if ((fd->refs->ref_id == (ref_entry **)0x0) ||
                    (fd->refs->ref_id[id] == (ref_entry *)0x0)) {
              fd_local._4_4_ = -1;
            }
            else {
              fd_local._4_4_ = 0;
            }
          }
        }
      }
    }
  }
  return fd_local._4_4_;
}

Assistant:

static int cram_populate_ref(cram_fd *fd, int id, ref_entry *r) {
    char *ref_path = getenv("REF_PATH");
    SAM_hdr_type *ty;
    SAM_hdr_tag *tag;
    char path[PATH_MAX], path_tmp[PATH_MAX], cache[PATH_MAX];
    char *local_cache = getenv("REF_CACHE");
    mFILE *mf;

    if (fd->verbose)
	fprintf(stderr, "cram_populate_ref on fd %p, id %d\n", fd, id);

    if (!ref_path || *ref_path == '\0') {
	/*
	 * If we have no ref path, we use the EBI server.
	 * However to avoid spamming it we require a local ref cache too.
	 */
	ref_path = "http://www.ebi.ac.uk:80/ena/cram/md5/%s";
	if (!local_cache || *local_cache == '\0') {
	    const char *extra;
	    const char *base = get_cache_basedir(&extra);
	    snprintf(cache,PATH_MAX, "%s%s/hts-ref/%%2s/%%2s/%%s", base, extra);
	    local_cache = cache;
	    if (fd->verbose)
		fprintf(stderr, "Populating local cache: %s\n", local_cache);
	}
    }

    if (!r->name)
	return -1;

    if (!(ty = sam_hdr_find(fd->header, "SQ", "SN", r->name)))
	return -1;

    if (!(tag = sam_hdr_find_key(fd->header, ty, "M5", NULL)))
	goto no_M5;

    if (fd->verbose)
	fprintf(stderr, "Querying ref %s\n", tag->str+3);

    /* Use cache if available */
    if (local_cache && *local_cache) {
	struct stat sb;
	BGZF *fp;

	expand_cache_path(path, local_cache, tag->str+3);

	if (0 == stat(path, &sb) && (fp = bgzf_open(path, "r"))) {
	    r->length = sb.st_size;
	    r->offset = r->line_length = r->bases_per_line = 0;

	    r->fn = string_dup(fd->refs->pool, path);

	    if (fd->refs->fp)
		if (bgzf_close(fd->refs->fp) != 0)
		    return -1;
	    fd->refs->fp = fp;
	    fd->refs->fn = r->fn;

	    // Fall back to cram_get_ref() where it'll do the actual
	    // reading of the file.
	    return 0;
	}
    }

    /* Otherwise search */
    if ((mf = open_path_mfile(tag->str+3, ref_path, NULL))) {
	size_t sz;
	r->seq = mfsteal(mf, &sz);
	r->length = sz;
    } else {
	refs_t *refs;
	char *fn;

    no_M5:
	/* Failed to find in search path or M5 cache, see if @SQ UR: tag? */
	if (!(tag = sam_hdr_find_key(fd->header, ty, "UR", NULL)))
	    return -1;

	fn = (strncmp(tag->str+3, "file:", 5) == 0)
	    ? tag->str+8
	    : tag->str+3;

	if (fd->refs->fp) {
	    if (bgzf_close(fd->refs->fp) != 0)
		return -1;
	    fd->refs->fp = NULL;
	}
	if (!(refs = refs_load_fai(fd->refs, fn, 0)))
	    return -1;
	fd->refs = refs;
	if (fd->refs->fp) {
	    if (bgzf_close(fd->refs->fp) != 0)
		return -1;
	    fd->refs->fp = NULL;
	}

	if (!fd->refs->fn)
	    return -1;

	if (-1 == refs2id(fd->refs, fd->header))
	    return -1;
	if (!fd->refs->ref_id || !fd->refs->ref_id[id])
	    return -1;

	// Local copy already, so fall back to cram_get_ref().
	return 0;
    }

    /* Populate the local disk cache if required */
    if (local_cache && *local_cache) {
	FILE *fp;
	int i;

	expand_cache_path(path, local_cache, tag->str+3);
	if (fd->verbose)
	    fprintf(stderr, "Path='%s'\n", path);
	mkdir_prefix(path, 01777);

	i = 0;
	do {
	    sprintf(path_tmp, "%s.tmp_%d", path, /*getpid(),*/ i);
	    i++;
	    fp = fopen(path_tmp, "wx");
	} while (fp == NULL && errno == EEXIST);
	if (!fp) {
	    perror(path_tmp);

	    // Not fatal - we have the data already so keep going.
	    return 0;
	}

	if (r->length != fwrite(r->seq, 1, r->length, fp)) {
	    perror(path);
	}
	if (-1 == paranoid_fclose(fp)) {
	    unlink(path_tmp);
	} else {
	    if (0 == chmod(path_tmp, 0444))
		rename(path_tmp, path);
	    else
		unlink(path_tmp);
	}
    }

    return 0;
}